

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_generate_ttf_font_atlas
          (rf_image *__return_storage_ptr__,rf_ttf_font_info *font_info,int atlas_width,int padding,
          rf_glyph_info *glyphs,rf_int glyphs_count,rf_font_antialias antialias,unsigned_short *dst,
          rf_int dst_count,rf_allocator temp_allocator)

{
  long lVar1;
  rf_source_location rVar2;
  rf_source_location rVar3;
  rf_allocator_args rVar4;
  undefined1 auVar5 [24];
  int iVar6;
  uchar *output;
  long *in_FS_OFFSET;
  uint uStack_d4;
  byte local_a1;
  int dst_index;
  uchar glyph_pixel;
  rf_int x;
  rf_int y;
  stbtt_fontinfo *stbtt_ctx;
  rf_int i_1;
  int offset_y;
  int offset_x;
  uint uStack_64;
  uchar *glyph_buffer;
  long lStack_38;
  int area;
  rf_int i;
  int largest_glyph_size;
  int atlas_pixel_count;
  rf_int glyphs_count_local;
  rf_glyph_info *glyphs_local;
  int padding_local;
  int atlas_width_local;
  rf_ttf_font_info *font_info_local;
  
  memset(__return_storage_ptr__,0,0x18);
  if ((((font_info != (rf_ttf_font_info *)0x0) && ((font_info->valid & 1U) != 0)) &&
      (dst != (unsigned_short *)0x0)) && (atlas_width * atlas_width <= dst_count)) {
    memset(dst,0,(long)(atlas_width * atlas_width * 2));
    i._0_4_ = 0;
    for (lStack_38 = 0; lStack_38 < glyphs_count; lStack_38 = lStack_38 + 1) {
      iVar6 = (int)(glyphs[lStack_38].field_0.rec.width * glyphs[lStack_38].field_0.rec.height);
      if ((int)i < iVar6) {
        i._0_4_ = iVar6;
      }
    }
    rVar2.proc_name = "rf_generate_ttf_font_atlas";
    rVar2.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar2.line_in_file = 0x5bc7;
    auVar5._8_8_ = (ulong)uStack_64 << 0x20;
    auVar5._0_8_ = (long)(int)i;
    auVar5._16_8_ = 0;
    output = (uchar *)(*temp_allocator.allocator_proc)
                                (&temp_allocator,rVar2,RF_AM_ALLOC,
                                 (rf_allocator_args)(auVar5 << 0x40));
    if (output != (uchar *)0x0) {
      i_1._4_4_ = 2;
      i_1._0_4_ = 2;
      lVar1 = *in_FS_OFFSET;
      *(void **)(lVar1 + -0x440) = temp_allocator.user_data;
      *(rf_allocator_proc **)(lVar1 + -0x438) = temp_allocator.allocator_proc;
      for (stbtt_ctx = (stbtt_fontinfo *)0x0; (long)stbtt_ctx < glyphs_count;
          stbtt_ctx = (stbtt_fontinfo *)((long)&stbtt_ctx->userdata + 1)) {
        stbtt_MakeCodepointBitmap
                  ((stbtt_fontinfo *)&font_info->internal_stb_font_info,output,
                   (int)glyphs[(long)stbtt_ctx].field_0.rec.width,
                   (int)glyphs[(long)stbtt_ctx].field_0.rec.height,
                   (int)glyphs[(long)stbtt_ctx].field_0.rec.width,font_info->scale_factor,
                   font_info->scale_factor,glyphs[(long)stbtt_ctx].codepoint);
        for (x = 0; (float)x < glyphs[(long)stbtt_ctx].field_0.rec.height; x = x + 1) {
          for (_dst_index = 0; (float)_dst_index < glyphs[(long)stbtt_ctx].field_0.rec.width;
              _dst_index = _dst_index + 1) {
            local_a1 = output[x * (int)glyphs[(long)stbtt_ctx].field_0.rec.width + _dst_index];
            if ((antialias == RF_FONT_NO_ANTIALIAS) && (0x50 < local_a1)) {
              local_a1 = 0;
            }
            iVar6 = ((int)i_1 + (int)x) * atlas_width + i_1._4_4_ + (int)_dst_index;
            *(undefined1 *)(dst + iVar6) = 0xff;
            *(byte *)((long)dst + (long)iVar6 * 2 + 1) = local_a1;
          }
        }
        glyphs[(long)stbtt_ctx].field_0.rec.x = (float)i_1._4_4_;
        glyphs[(long)stbtt_ctx].field_0.rec.y = (float)(int)i_1;
        i_1._4_4_ = (int)((float)i_1._4_4_ +
                         glyphs[(long)stbtt_ctx].field_0.rec.width + (float)(padding << 1));
        if ((((float)atlas_width - glyphs[(long)stbtt_ctx].field_0.rec.width) -
             (float)(padding << 1) <= (float)i_1._4_4_) &&
           (i_1._0_4_ = font_info->font_size + padding + (int)i_1, i_1._4_4_ = padding,
           (atlas_width - font_info->font_size) - padding < (int)i_1)) break;
      }
      lVar1 = *in_FS_OFFSET;
      *(undefined8 *)(lVar1 + -0x440) = 0;
      *(undefined8 *)(lVar1 + -0x438) = 0;
      __return_storage_ptr__->data = dst;
      __return_storage_ptr__->width = atlas_width;
      __return_storage_ptr__->height = atlas_width;
      __return_storage_ptr__->format = RF_UNCOMPRESSED_GRAY_ALPHA;
      __return_storage_ptr__->valid = true;
    }
    rVar3.proc_name = "rf_generate_ttf_font_atlas";
    rVar3.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar3.line_in_file = 0x5c05;
    rVar4.size_to_allocate_or_reallocate = 0;
    rVar4.pointer_to_free_or_realloc = output;
    rVar4._16_8_ = (ulong)uStack_d4 << 0x20;
    (*temp_allocator.allocator_proc)(&temp_allocator,rVar3,RF_AM_FREE,rVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_generate_ttf_font_atlas(rf_ttf_font_info* font_info, int atlas_width, int padding, rf_glyph_info* glyphs, rf_int glyphs_count, rf_font_antialias antialias, unsigned short* dst, rf_int dst_count, rf_allocator temp_allocator)
{
    rf_image result = {0};

    if (font_info && font_info->valid)
    {
        int atlas_pixel_count = atlas_width * atlas_width;

        if (dst && dst_count >= atlas_pixel_count)
        {
            memset(dst, 0, atlas_pixel_count * 2);

            int largest_glyph_size = 0;
            for (rf_int i = 0; i < glyphs_count; i++)
            {
                int area = glyphs[i].width * glyphs[i].height;
                if (area > largest_glyph_size)
                {
                    largest_glyph_size = area;
                }
            }

            // Allocate a grayscale buffer large enough to store the largest glyph
            unsigned char* glyph_buffer = RF_ALLOC(temp_allocator, largest_glyph_size);

            // Use basic packing algorithm to generate the atlas
            if (glyph_buffer)
            {
                // We update these for every pixel in the loop
                int offset_x = RF_BUILTIN_FONT_PADDING;
                int offset_y = RF_BUILTIN_FONT_PADDING;

                // Set the allocator for stbtt
                RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
                {
                    // Using simple packaging, one char after another
                    for (rf_int i = 0; i < glyphs_count; i++)
                    {
                        // Extract these variables to shorter names
                        stbtt_fontinfo* stbtt_ctx = (stbtt_fontinfo*) &font_info->internal_stb_font_info;

                        // Get glyph bitmap
                        stbtt_MakeCodepointBitmap(stbtt_ctx, glyph_buffer, glyphs[i].width, glyphs[i].height, glyphs[i].width, font_info->scale_factor, font_info->scale_factor, glyphs[i].codepoint);

                        // Copy pixel data from fc.data to atlas
                        for (rf_int y = 0; y < glyphs[i].height; y++)
                        {
                            for (rf_int x = 0; x < glyphs[i].width; x++)
                            {
                                unsigned char glyph_pixel = glyph_buffer[y * ((int)glyphs[i].width) + x];
                                if (antialias == RF_FONT_NO_ANTIALIAS && glyph_pixel > RF_BITMAP_ALPHA_THRESHOLD) glyph_pixel = 0;

                                int dst_index = (offset_y + y) * atlas_width + (offset_x + x);
                                // dst is in RF_UNCOMPRESSED_GRAY_ALPHA which is 2 bytes
                                // for fonts we write the glyph_pixel in the alpha channel which is byte 2
                                ((unsigned char*)(&dst[dst_index]))[0] = 255;
                                ((unsigned char*)(&dst[dst_index]))[1] = glyph_pixel;
                            }
                        }

                        // Fill chars rectangles in atlas info
                        glyphs[i].x = (float)offset_x;
                        glyphs[i].y = (float)offset_y;

                        // Move atlas position X for next character drawing
                        offset_x += (glyphs[i].width + 2 * padding);
                        if (offset_x >= (atlas_width - glyphs[i].width - 2 * padding))
                        {
                            offset_x  = padding;
                            offset_y += font_info->font_size + padding;

                            if (offset_y > (atlas_width - font_info->font_size - padding)) break;
                            //else error dst buffer is not big enough
                        }
                    }
                }
                RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

                result.data   = dst;
                result.width  = atlas_width;
                result.height = atlas_width;
                result.format = RF_UNCOMPRESSED_GRAY_ALPHA;
                result.valid  = true;
            }

            RF_FREE(temp_allocator, glyph_buffer);
        }
    }

    return result;
}